

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptravltree.h
# Opt level: O2

Node * cookmem::PtrAVLTree::rotateWithLeftChild(Node *root)

{
  Node *node;
  
  node = root->left;
  root->left = node->right;
  node->right = root;
  updateHeight(root);
  updateHeight(node);
  return node;
}

Assistant:

inline static Node*
    rotateWithLeftChild (Node* root)
    {
        Node* left = root->left;
        setLeftChild (root, left->right);
        setRightChild (left, root);
        updateHeight (root);
        updateHeight (left);
        return left;
    }